

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O1

shared_ptr<chrono::curiosity::CuriosityWheel> __thiscall
chrono::curiosity::Curiosity::GetWheel(Curiosity *this,CuriosityWheelID id)

{
  long lVar1;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined4 in_register_00000034;
  shared_ptr<chrono::curiosity::CuriosityWheel> sVar3;
  shared_ptr<chrono::curiosity::CuriosityWheel> sVar4;
  
  lVar1 = (in_RDX & 0xffffffff) * 0x10;
  _Var2._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 (CONCAT44(in_register_00000034,id) + 0x20 + lVar1);
  this->m_system = (ChSystem *)_Var2._M_pi;
  lVar1 = *(long *)(CONCAT44(in_register_00000034,id) + 0x28 + lVar1);
  *(long *)&this->m_initialized = lVar1;
  if (lVar1 != 0) {
    _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      sVar3.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar3.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)this;
      return (shared_ptr<chrono::curiosity::CuriosityWheel>)
             sVar3.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
    LOCK();
    *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
    UNLOCK();
  }
  sVar4.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  sVar4.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::curiosity::CuriosityWheel>)
         sVar4.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CuriosityWheel> Curiosity::GetWheel(CuriosityWheelID id) const {
    return m_wheels[id];
}